

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::Model::project_weights(Model *this,float radius)

{
  bool bVar1;
  reference ppPVar2;
  ostream *this_00;
  void *this_01;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  size_t in_stack_00000008;
  int i;
  double gg;
  ParametersBase *p;
  iterator __end1;
  iterator __begin1;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  int pi;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar6;
  double local_38;
  __normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
  local_20 [2];
  int local_10;
  
  if (project_weights::project_scratch == (float *)0x0) {
    std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::size(in_RDI);
    project_weights::project_scratch = (float *)cnn_mm_malloc((size_t)gg,in_stack_00000008);
  }
  local_10 = 0;
  local_20[0]._M_current =
       (ParametersBase **)
       std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::begin(in_RDI);
  std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (__normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
              ::operator*(local_20);
    (*(*ppPVar2)->_vptr_ParametersBase[1])(*ppPVar2,project_weights::project_scratch + local_10);
    local_10 = local_10 + 1;
    __gnu_cxx::
    __normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
    ::operator++(local_20);
  }
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  local_38 = 0.0;
  for (iVar6 = 0; auVar3 = auVar4._0_16_, iVar6 < local_10; iVar6 = iVar6 + 1) {
    local_38 = (double)project_weights::project_scratch[iVar6] + local_38;
    auVar4 = ZEXT864((ulong)local_38);
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"NORM: ");
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_38;
  auVar3 = vsqrtsd_avx(auVar3,auVar5);
  this_01 = (void *)std::ostream::operator<<(this_00,auVar3._0_8_);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Model::project_weights(float radius) {
  static float* project_scratch = 0;
  if (!project_scratch)
    project_scratch = (float*)cnn_mm_malloc(all_params.size() * sizeof(float), 256);
  int pi = 0;
  for (auto p : all_params) {
    p->squared_l2norm(&project_scratch[pi]);
    ++pi;
  }
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += project_scratch[i];
  cerr << "NORM: " << sqrt(gg) << endl;
}